

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O0

void __thiscall Header::Header(Header *this,path *path)

{
  uint16_t uVar1;
  path *path_local;
  Header *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  ::unordered_set(&this->m_dependancies);
  std::filesystem::__cxx11::path::path(&this->m_fullPath,path);
  std::filesystem::__cxx11::path::filename(&this->m_fileName,path);
  uVar1 = id + 1;
  this->m_id = id;
  id = uVar1;
  return;
}

Assistant:

Header::Header(const fs::path & path)
    :   m_fullPath  (path)
    ,   m_fileName  (path.filename())
    ,   m_id        (id++)
{ }